

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_rewriter.cpp
# Opt level: O1

void __thiscall
duckdb::SumRewriterOptimizer::RewriteSums
          (SumRewriterOptimizer *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  undefined1 *__n;
  ExpressionType EVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  long *plVar3;
  ClientContext *context;
  Optimizer *pOVar4;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var5;
  ColumnBinding binding;
  undefined8 uVar6;
  int iVar7;
  pointer pLVar8;
  reference pvVar9;
  pointer pEVar10;
  type pEVar11;
  reference pvVar12;
  BoundAggregateExpression *pBVar13;
  BoundFunctionExpression *pBVar14;
  pointer pEVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> table_index;
  mapped_type *pmVar16;
  BoundColumnRefExpression *pBVar17;
  long *plVar18;
  LogicalProjection *this_00;
  pointer pLVar19;
  long lVar20;
  pointer *__ptr;
  undefined8 *puVar21;
  _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var22;
  long *plVar23;
  size_type __n_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_01;
  LogicalType *other;
  byte bVar24;
  ColumnBinding binding_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> const_expr_1;
  type const_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> multiply;
  templated_unique_single_t proj;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  count_aggr;
  type main_expr;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_expressions;
  FunctionBinder function_binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  constants;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  rewrote_map;
  AggregateFunction count_fun;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  optional_idx local_3e8;
  ClientContext *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_3c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3a8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_3a0;
  FunctionBinder local_398;
  vector<std::reference_wrapper<duckdb::Expression>,_true> local_388;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_368
  ;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_360;
  _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_358;
  pointer local_350;
  LogicalType *local_348;
  Binder *local_340;
  undefined1 local_338 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  optional_idx local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2e8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uStack_2e0;
  pointer local_2d8;
  undefined1 local_2d0 [56];
  undefined1 local_298 [16];
  BoundColumnRefExpression local_288;
  LogicalType LStack_208;
  FunctionStability local_1f0;
  FunctionNullHandling FStack_1ef;
  FunctionErrors FStack_1ee;
  FunctionCollationHandling FStack_1ed;
  undefined8 auStack_1e8 [13];
  undefined2 local_180;
  undefined8 local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  undefined1 local_160 [176];
  _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  local_b0 [112];
  undefined8 local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar24 = 0;
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  local_338._24_8_ = LogicalOperator::Cast<duckdb::LogicalAggregate>(pLVar8);
  if ((((LogicalAggregate *)local_338._24_8_)->groups).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (((LogicalAggregate *)local_338._24_8_)->groups).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2d0._0_8_ = local_2d0 + 0x30;
    local_2d0._8_8_ = &DAT_00000001;
    local_2d0._16_8_ = (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)0x0;
    local_2d0._24_8_ = (element_type *)0x0;
    local_2d0._32_4_ = 1.0;
    local_2d0._40_8_ = 0;
    local_2d0._48_8_ = (element_type *)0x0;
    local_308.index = 0;
    local_318._0_8_ = 0;
    local_318._8_8_ = (pointer)0x0;
    local_360 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                 *)&(((LogicalAggregate *)local_338._24_8_)->super_LogicalOperator).expressions;
    local_300._8_8_ =
         (((LogicalAggregate *)local_338._24_8_)->super_LogicalOperator).expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_300._M_allocated_capacity =
         (size_type)
         (((LogicalAggregate *)local_338._24_8_)->super_LogicalOperator).expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_340 = (Binder *)((long)(local_300._M_allocated_capacity - local_300._8_8_) >> 3);
    local_408._8_8_ = (Binder *)0x0;
    local_368 = op;
    local_338._16_8_ = this;
    if (local_300._M_allocated_capacity != local_300._8_8_) {
      local_3d8 = (ClientContext *)&this->sum_matcher;
      local_418._8_8_ = local_160 + 0x90;
      local_348 = &LStack_208;
      local_358 = local_b0;
      local_350 = (pointer)&PTR__BaseScalarFunction_019937c0;
      do {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)local_360,local_408._8_8_);
        local_388.
        super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_388.
        super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_388.
        super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pEVar10 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
                  ::operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
                                *)local_3d8);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar9);
        iVar7 = (*pEVar10->_vptr_ExpressionMatcher[2])(pEVar10,pEVar11,&local_388);
        if ((char)iVar7 != '\0') {
          pvVar12 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                              (&local_388,0);
          pBVar13 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                              (&pvVar12->_M_data->super_BaseExpression);
          pvVar12 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                              (&local_388,1);
          pBVar14 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                              (&pvVar12->_M_data->super_BaseExpression);
          this_01 = &pBVar14->children;
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_01,0);
          pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar9);
          EVar1 = (pEVar15->super_BaseExpression).type;
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_01,(ulong)(EVar1 != VALUE_CONSTANT));
          local_408._0_8_ =
               (pvVar9->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_01,(ulong)(EVar1 == VALUE_CONSTANT));
          local_398.context =
               (ClientContext *)
               (pvVar9->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_398.context);
          this = (SumRewriterOptimizer *)local_338._16_8_;
          (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0x11])
                    ((BaseScalarFunction *)local_298);
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](&pBVar13->children,0);
          uVar6 = local_298._0_8_;
          local_298._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          _Var2._M_head_impl =
               (pvVar9->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar6;
          if (_Var2._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            (*(*(_func_int ***)local_298._0_8_)[1])();
          }
          FunctionBinder::FunctionBinder
                    ((FunctionBinder *)local_338,(*(Optimizer **)((long)this + 8))->context);
          CountFunctionBase::GetFunction();
          local_3f8._M_allocated_capacity = 0;
          local_3f8._8_8_ = 0;
          local_3e8.index = 0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)local_3f8._M_local_buf,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_398.context);
          SimpleFunction::SimpleFunction((SimpleFunction *)local_160,(SimpleFunction *)local_298);
          local_160._0_8_ = local_350;
          LogicalType::LogicalType((LogicalType *)local_418._8_8_,local_348);
          local_160[0xa8] = local_1f0;
          local_160[0xa9] = FStack_1ef;
          local_160[0xaa] = FStack_1ee;
          local_160[0xab] = FStack_1ed;
          local_160._0_8_ = &PTR__AggregateFunction_01996688;
          puVar21 = auStack_1e8;
          p_Var22 = local_358;
          for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
            *(undefined8 *)p_Var22 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
            p_Var22 = p_Var22 + (ulong)bVar24 * -0x10 + 8;
          }
          *(undefined2 *)(local_358 + 0x68) = local_180;
          local_40 = local_178;
          local_38 = local_170;
          if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_170->_M_use_count = local_170->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_170->_M_use_count = local_170->_M_use_count + 1;
            }
          }
          local_2e8._M_head_impl = (Expression *)local_3f8._M_allocated_capacity;
          uStack_2e0.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               local_3f8._8_8_;
          local_2d8 = (pointer)local_3e8.index;
          local_3f8._M_allocated_capacity = 0;
          local_3f8._8_8_ = 0;
          local_3e8.index = 0;
          local_3a0._M_head_impl = (BoundCastData *)0x0;
          FunctionBinder::BindAggregateFunction
                    (&local_398,(AggregateFunction *)local_338,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)local_160,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_2e8,(AggregateType)&local_3a0);
          if ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
               )local_3a0._M_head_impl != (BoundCastData *)0x0) {
            (*(local_3a0._M_head_impl)->_vptr_BoundCastData[1])();
          }
          local_3a0._M_head_impl = (BoundCastData *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_2e8);
          local_160._0_8_ = &PTR__AggregateFunction_01996688;
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_160);
          local_418._0_8_ = local_398.binder.ptr;
          local_398.binder.ptr = (Binder *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    (local_360,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_418);
          if ((Expression *)local_418._0_8_ != (Expression *)0x0) {
            (*((BaseExpression *)local_418._0_8_)->_vptr_BaseExpression[1])();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)(local_338 + 0x20),
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_408);
          local_418._0_8_ = local_2d0;
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_418._0_8_,local_408 + 8,local_418);
          if (local_398.binder.ptr != (Binder *)0x0) {
            (*((BaseExpression *)
              &(local_398.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
              _vptr_BaseExpression[1])();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)local_3f8._M_local_buf);
          local_298._0_8_ = &PTR__AggregateFunction_01996688;
          if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
          }
          BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
          if (local_398.context != (ClientContext *)0x0) {
            (*((BaseExpression *)
              &(local_398.context)->super_enable_shared_from_this<duckdb::ClientContext>)->
              _vptr_BaseExpression[1])();
          }
          if ((Expression *)local_408._0_8_ != (Expression *)0x0) {
            (**(code **)(*(long *)local_408._0_8_ + 8))();
          }
        }
        if (local_388.
            super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_388.
                          super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        local_408._8_8_ =
             (long)&(((enable_shared_from_this<duckdb::Binder> *)local_408._8_8_)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
        ;
      } while ((ulong)local_408._8_8_ < local_340);
    }
    if ((element_type *)local_2d0._24_8_ != (element_type *)0x0) {
      local_388.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      table_index._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           Binder::GenerateTableIndex(this->optimizer->binder);
      if (local_300._M_allocated_capacity != local_300._8_8_) {
        p_Var22 = (_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->aggregate_map;
        local_348 = (LogicalType *)
                    ((long)&(local_340->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                            internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + (ulong)(local_340 == (Binder *)0x0));
        local_3d8 = (ClientContext *)0x0;
        __n_00 = 0;
        local_358 = p_Var22;
        local_2f0._M_pi = table_index._M_pi;
        do {
          local_3f8._M_allocated_capacity = *(idx_t *)(local_338._24_8_ + 0x70);
          local_3f8._8_8_ = __n_00;
          pmVar16 = ::std::__detail::
                    _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var22,(key_type *)&local_3f8);
          pmVar16->table_index = (idx_t)table_index._M_pi;
          pmVar16->column_index = __n_00;
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                 *)local_360,__n_00);
          pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar9);
          pBVar17 = (BoundColumnRefExpression *)operator_new(0x70);
          other = &pEVar15->return_type;
          LogicalType::LogicalType((LogicalType *)local_298,other);
          binding.column_index = local_3f8._8_8_;
          binding.table_index = local_3f8._M_allocated_capacity;
          BoundColumnRefExpression::BoundColumnRefExpression
                    (pBVar17,(LogicalType *)local_298,binding,0);
          LogicalType::~LogicalType((LogicalType *)local_298);
          plVar3 = *(long **)((LogicalTypeId *)local_2d0._0_8_ +
                             (__n_00 % (ulong)local_2d0._8_8_) * 8);
          plVar18 = (long *)0x0;
          if ((plVar3 != (long *)0x0) &&
             (plVar18 = plVar3, plVar23 = (long *)*plVar3, __n_00 != ((long *)*plVar3)[1])) {
            while (plVar3 = (long *)*plVar23, plVar3 != (long *)0x0) {
              plVar18 = (long *)0x0;
              if (((ulong)plVar3[1] % (ulong)local_2d0._8_8_ != __n_00 % (ulong)local_2d0._8_8_) ||
                 (plVar18 = plVar23, plVar23 = plVar3, __n_00 == plVar3[1])) goto LAB_006a804a;
            }
            plVar18 = (long *)0x0;
          }
LAB_006a804a:
          if ((plVar18 == (long *)0x0) || (*plVar18 == 0)) {
            local_298._0_8_ = pBVar17;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_388,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_298);
            if ((BoundColumnRefExpression *)local_298._0_8_ != (BoundColumnRefExpression *)0x0) {
              (*(((Expression *)local_298._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
          }
          else {
            __n = (undefined1 *)
                  ((long)&(((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                             *)&(local_3d8->super_enable_shared_from_this<duckdb::ClientContext>).
                                __weak_this_.internal.
                                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>).
                          _M_head_impl + (long)local_340);
            local_350 = *(pointer *)(local_338._24_8_ + 0x70);
            local_418._8_8_ = pBVar17;
            pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                   *)local_360,(size_type)__n);
            pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(pvVar9);
            pBVar17 = (BoundColumnRefExpression *)operator_new(0x70);
            LogicalType::LogicalType((LogicalType *)local_298,&pEVar15->return_type);
            binding_00.column_index = (idx_t)__n;
            binding_00.table_index = (idx_t)local_350;
            BoundColumnRefExpression::BoundColumnRefExpression
                      (pBVar17,(LogicalType *)local_298,binding_00,0);
            uVar6 = local_338._16_8_;
            LogicalType::~LogicalType((LogicalType *)local_298);
            local_3a8._M_head_impl = (Expression *)pBVar17;
            BoundCastExpression::AddCastToType
                      ((BoundCastExpression *)local_338,(*(Optimizer **)(uVar6 + 8))->context,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_3a8,other,false);
            if ((BoundColumnRefExpression *)local_3a8._M_head_impl !=
                (BoundColumnRefExpression *)0x0) {
              (*(((Expression *)&(local_3a8._M_head_impl)->super_BaseExpression)->
                super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_3a8._M_head_impl = (Expression *)0x0;
            context = (*(Optimizer **)(uVar6 + 8))->context;
            pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                   *)(local_338 + 0x20),(size_type)local_3d8);
            local_3b0._M_head_impl =
                 (pvVar9->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            BoundCastExpression::AddCastToType
                      ((BoundCastExpression *)local_418,context,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_3b0,other,false);
            if (local_3b0._M_head_impl != (Expression *)0x0) {
              (*((local_3b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_3b0._M_head_impl = (Expression *)0x0;
            pOVar4 = *(Optimizer **)(uVar6 + 8);
            local_298._0_8_ = local_298 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_298,anon_var_dwarf_643547e + 8,anon_var_dwarf_643547e + 9);
            local_3b8._M_head_impl = (Expression *)local_338._0_8_;
            local_338._0_8_ = (Binder *)0x0;
            local_3c0._M_head_impl = (Expression *)local_418._0_8_;
            local_418._0_8_ =
                 (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                  )0x0;
            Optimizer::BindScalarFunction
                      ((Optimizer *)(local_408 + 8),(string *)pOVar4,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_298,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_3b8);
            if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                local_3c0._M_head_impl != (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
              (**(code **)(*(long *)local_3c0._M_head_impl + 8))();
            }
            local_3c0._M_head_impl = (Expression *)0x0;
            if ((Binder *)local_3b8._M_head_impl != (Binder *)0x0) {
              (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                           &((local_3b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                          internal).super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                        internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)();
            }
            local_3b8._M_head_impl = (Expression *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_298 + 0x10)) {
              operator_delete((void *)local_298._0_8_);
            }
            pOVar4 = *(Optimizer **)(uVar6 + 8);
            local_298._0_8_ = local_298 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"+","");
            local_3c8._M_head_impl = (BaseStatistics *)local_418._8_8_;
            local_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
            local_408._8_8_ = (Binder *)0x0;
            Optimizer::BindScalarFunction
                      ((Optimizer *)local_408,(string *)pOVar4,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_298,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_3c8);
            table_index._M_pi = local_2f0._M_pi;
            p_Var22 = local_358;
            if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*(local_3d0._M_pi)->_vptr__Sp_counted_base[1])();
            }
            local_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)local_3c8._M_head_impl !=
                (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
              (*(((Expression *)&(local_3c8._M_head_impl)->type)->super_BaseExpression).
                _vptr_BaseExpression[1])();
            }
            local_3c8._M_head_impl = (BaseStatistics *)0x0;
            if ((BoundColumnRefExpression *)local_298._0_8_ !=
                (BoundColumnRefExpression *)(local_298 + 0x10)) {
              operator_delete((void *)local_298._0_8_);
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_388,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_408);
            if ((Expression *)local_408._0_8_ != (Expression *)0x0) {
              (**(code **)(*(long *)local_408._0_8_ + 8))();
            }
            if ((Binder *)local_408._8_8_ != (Binder *)0x0) {
              (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_408._8_8_)->
                          __weak_this_).internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)();
            }
            if ((Expression *)local_418._0_8_ != (Expression *)0x0) {
              (*((BaseExpression *)local_418._0_8_)->_vptr_BaseExpression[1])();
            }
            if ((Binder *)local_338._0_8_ != (Binder *)0x0) {
              (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_338._0_8_)->
                          __weak_this_).internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)();
            }
            local_3d8 = (ClientContext *)
                        ((long)&(((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                                   *)&(local_3d8->
                                      super_enable_shared_from_this<duckdb::ClientContext>).
                                      __weak_this_.internal.
                                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>).
                                _M_head_impl + 1);
          }
          __n_00 = __n_00 + 1;
        } while ((LogicalType *)__n_00 != local_348);
      }
      this_00 = (LogicalProjection *)operator_new(0x70);
      local_298._0_8_ =
           local_388.
           super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_298._8_8_ =
           local_388.
           super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_288.super_Expression.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)
           local_388.
           super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_388.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LogicalProjection::LogicalProjection
                (this_00,(idx_t)table_index._M_pi,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_298);
      local_3f8._M_allocated_capacity = (size_type)this_00;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_298);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(local_368);
      if (pLVar8->has_estimated_cardinality == true) {
        pLVar19 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_3f8._M_allocated_capacity);
        pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(local_368);
        LogicalOperator::SetEstimatedCardinality
                  (&pLVar19->super_LogicalOperator,pLVar8->estimated_cardinality);
      }
      pLVar19 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)&local_3f8._M_allocated_capacity);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar19->super_LogicalOperator).children,local_368);
      uVar6 = local_3f8._M_allocated_capacity;
      local_3f8._M_allocated_capacity = 0;
      _Var5._M_head_impl =
           (local_368->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_368->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar6;
      if (_Var5._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var5._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if ((long *)local_3f8._M_allocated_capacity != (long *)0x0) {
        (**(code **)(*(long *)local_3f8._M_allocated_capacity + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_388);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)(local_338 + 0x20));
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_2d0);
  }
  return;
}

Assistant:

void SumRewriterOptimizer::RewriteSums(unique_ptr<LogicalOperator> &op) {
	auto &aggr = op->Cast<LogicalAggregate>();
	if (!aggr.groups.empty()) {
		return;
	}

	unordered_set<idx_t> rewrote_map;
	vector<unique_ptr<Expression>> constants;
	idx_t aggr_count = aggr.expressions.size();
	for (idx_t i = 0; i < aggr_count; ++i) {
		auto &expr = aggr.expressions[i];
		vector<reference<Expression>> bindings;
		if (!sum_matcher->Match(*expr, bindings)) {
			continue;
		}
		// found SUM(x + C)
		auto &sum = bindings[0].get().Cast<BoundAggregateExpression>();
		auto &addition = bindings[1].get().Cast<BoundFunctionExpression>();
		idx_t const_idx = addition.children[0]->GetExpressionType() == ExpressionType::VALUE_CONSTANT ? 0 : 1;
		auto const_expr = std::move(addition.children[const_idx]);
		auto main_expr = std::move(addition.children[1 - const_idx]);

		// turn this into SUM(x)
		sum.children[0] = main_expr->Copy();

		// push a new aggregate - COUNT(x)
		FunctionBinder function_binder(optimizer.context);

		auto count_fun = CountFunctionBase::GetFunction();
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(main_expr));
		auto count_aggr =
		    function_binder.BindAggregateFunction(count_fun, std::move(children), nullptr, AggregateType::NON_DISTINCT);
		aggr.expressions.push_back(std::move(count_aggr));
		constants.push_back(std::move(const_expr));
		rewrote_map.insert(i);
	}
	if (rewrote_map.empty()) {
		return;
	}
	vector<unique_ptr<Expression>> projection_expressions;
	// we rewrote aggregates - we need to push a projection in which we re-compute the original result
	idx_t rewritten_index = 0;
	auto proj_index = optimizer.binder.GenerateTableIndex();
	for (idx_t i = 0; i < aggr_count; i++) {
		ColumnBinding aggregate_binding(aggr.aggregate_index, i);
		aggregate_map[aggregate_binding] = ColumnBinding(proj_index, i);
		auto &aggr_type = aggr.expressions[i]->return_type;
		auto aggr_ref = make_uniq<BoundColumnRefExpression>(aggr_type, aggregate_binding);
		if (rewrote_map.find(i) == rewrote_map.end()) {
			// not rewritten - just push a reference
			projection_expressions.push_back(std::move(aggr_ref));
			continue;
		}
		// rewritten - need to compute the final result
		idx_t count_idx = aggr_count + rewritten_index;
		ColumnBinding count_binding(aggr.aggregate_index, count_idx);
		auto count_ref = make_uniq<BoundColumnRefExpression>(aggr.expressions[count_idx]->return_type, count_binding);

		// cast the count to the sum type
		auto cast_count = BoundCastExpression::AddCastToType(optimizer.context, std::move(count_ref), aggr_type);
		auto const_expr =
		    BoundCastExpression::AddCastToType(optimizer.context, std::move(constants[rewritten_index]), aggr_type);

		// bind the multiplication
		auto multiply = optimizer.BindScalarFunction("*", std::move(cast_count), std::move(const_expr));

		// add it to the sum
		auto final_result = optimizer.BindScalarFunction("+", std::move(aggr_ref), std::move(multiply));
		projection_expressions.push_back(std::move(final_result));

		rewritten_index++;
	}

	// push the projection to replace the aggregate
	auto proj = make_uniq<LogicalProjection>(proj_index, std::move(projection_expressions));
	if (op->has_estimated_cardinality) {
		proj->SetEstimatedCardinality(op->estimated_cardinality);
	}
	proj->children.push_back(std::move(op));
	op = std::move(proj);
}